

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateSchema(WriteAheadLogDeserializer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_158;
  CreateSchemaInfo info;
  
  CreateSchemaInfo::CreateSchemaInfo(&info);
  Deserializer::ReadProperty<std::__cxx11::string>
            (&bStack_158,&(this->deserializer).super_Deserializer,0x65,"schema");
  ::std::__cxx11::string::operator=((string *)&info.super_CreateInfo.schema,(string *)&bStack_158);
  ::std::__cxx11::string::~string((string *)&bStack_158);
  if (this->deserialize_only == false) {
    Catalog::CreateSchema(this->catalog,this->context,&info);
  }
  CreateInfo::~CreateInfo(&info.super_CreateInfo);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateSchema() {
	CreateSchemaInfo info;
	info.schema = deserializer.ReadProperty<string>(101, "schema");
	if (DeserializeOnly()) {
		return;
	}

	catalog.CreateSchema(context, info);
}